

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidgetPrivate::hideChildren(QWidgetPrivate *this,bool spontaneous)

{
  QWidget *this_00;
  ulong uVar1;
  QDebug *pQVar2;
  QWidget *pQVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  QDebug local_b8;
  undefined1 *puStack_b0;
  WidgetAttributes local_a0;
  QDebug local_98;
  undefined1 local_90 [8];
  QDebug local_88;
  anon_unknown_dwarf_27bb4f local_80 [8];
  QArrayDataPointer<QObject_*> local_78;
  Stream *local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  QWidgetData *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  QtPrivateLogging::lcWidgetShowHide();
  if (((byte)QtPrivateLogging::lcWidgetShowHide::category.field_2.bools.enabledDebug._q_value.
             _M_base._M_i & 1) != 0) {
    local_58 = 2;
    uStack_54 = 0;
    uStack_50._0_1_ = (QPaintDevice)0x0;
    uStack_50._1_3_ = 0;
    uStack_4c = 0;
    uStack_48 = 0;
    uStack_44 = 0;
    local_40 = (QWidgetData *)QtPrivateLogging::lcWidgetShowHide::category.name;
    QMessageLogger::debug();
    pQVar2 = QDebug::operator<<(&local_b8,"Hiding children of");
    local_60 = pQVar2->stream;
    *(int *)(local_60 + 0x28) = *(int *)(local_60 + 0x28) + 1;
    ::operator<<((Stream *)&local_78,(QWidget *)&local_60);
    pQVar2 = QDebug::operator<<((QDebug *)&local_78,"spontaneously");
    QDebug::operator<<(pQVar2,spontaneous);
    QDebug::~QDebug((QDebug *)&local_78);
    QDebug::~QDebug((QDebug *)&local_60);
    QDebug::~QDebug(&local_b8);
  }
  local_78.d = *(Data **)&this->field_0x18;
  local_78.ptr = *(QObject ***)&this->field_0x20;
  uVar1 = *(ulong *)&this->field_0x28;
  if (local_78.d != (Data *)0x0) {
    LOCK();
    ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_78.size = uVar1;
  for (uVar4 = 0; uVar4 < uVar1; uVar4 = uVar4 + 1) {
    pQVar3 = (QWidget *)((WId *)local_78.ptr)[uVar4];
    if ((pQVar3 != (QWidget *)0x0) && ((*(byte *)(*(long *)&pQVar3->field_0x8 + 0x30) & 1) != 0)) {
      QtPrivateLogging::lcWidgetShowHide();
      if (((byte)QtPrivateLogging::lcWidgetShowHide::category.field_2.bools.enabledDebug._q_value.
                 _M_base._M_i & 1) != 0) {
        local_58 = 2;
        uStack_54 = 0;
        uStack_50._0_1_ = (QPaintDevice)0x0;
        uStack_50._1_3_ = 0;
        uStack_4c = 0;
        uStack_48 = 0;
        uStack_44 = 0;
        local_40 = (QWidgetData *)QtPrivateLogging::lcWidgetShowHide::category.name;
        QMessageLogger::debug();
        pQVar2 = QDebug::operator<<(&local_98,"Considering");
        local_90 = (undefined1  [8])pQVar2->stream;
        *(int *)((long)local_90 + 0x28) = *(int *)((long)local_90 + 0x28) + 1;
        ::operator<<((Stream *)&local_b8,(QWidget *)local_90);
        pQVar2 = QDebug::operator<<(&local_b8,"with attributes");
        local_88.stream = pQVar2->stream;
        *(int *)(local_88.stream + 0x28) = *(int *)(local_88.stream + 0x28) + 1;
        local_a0.widget = pQVar3;
        anon_unknown.dwarf_27bb4f::operator<<(local_80,&local_88,&local_a0);
        QDebug::~QDebug((QDebug *)local_80);
        QDebug::~QDebug(&local_88);
        QDebug::~QDebug(&local_b8);
        QDebug::~QDebug((QDebug *)local_90);
        QDebug::~QDebug(&local_98);
      }
      if ((((pQVar3->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
            super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) &&
         ((pQVar3->data->widget_attributes & 0x8000) != 0)) {
        QWidget::setAttribute(pQVar3,(uint)!spontaneous * 4 + WA_Mapped,false);
        hideChildren(*(QWidgetPrivate **)&pQVar3->field_0x8,spontaneous);
        local_b8.stream = (Stream *)&DAT_aaaaaaaaaaaaaaaa;
        puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
        QHideEvent::QHideEvent((QHideEvent *)&local_b8);
        if (spontaneous) {
          QCoreApplication::sendSpontaneousEvent((QObject *)pQVar3,(QEvent *)&local_b8);
        }
        else {
          QCoreApplication::sendEvent((QObject *)pQVar3,(QEvent *)&local_b8);
          if ((pQVar3->data->winid != 0) &&
             (((*(QWidgetPrivate **)&pQVar3->field_0x8)->high_attributes[2] & 0x20) != 0)) {
            hide_sys(*(QWidgetPrivate **)&pQVar3->field_0x8);
          }
        }
        QApplicationPrivate::sendSyntheticEnterLeave
                  (*(QApplicationPrivate **)(QCoreApplication::self + 8),pQVar3);
        if (!spontaneous) {
          uStack_4c = 0xaaaaaaaa;
          local_58 = 0x80ddc0;
          uStack_54 = 0;
          uStack_50._0_1_ = (QPaintDevice)0x3;
          uStack_50._1_3_ = 0x80;
          uStack_48 = SUB84(pQVar3,0);
          uStack_44 = (undefined4)((ulong)pQVar3 >> 0x20);
          local_40 = (QWidgetData *)0xaaaaaaaaffffffff;
          QAccessible::updateAccessibility((QAccessibleEvent *)&local_58);
          QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_58);
        }
        QHideEvent::~QHideEvent((QHideEvent *)&local_b8);
      }
    }
  }
  pQVar3 = QWidget::window(this_00);
  if ((pQVar3 != (QWidget *)0x0) && ((pQVar3->data->field_0x11 & 2) != 0)) {
    QWidget::setAttribute(this_00,WA_UnderMouse,false);
  }
  QArrayDataPointer<QObject_*>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::hideChildren(bool spontaneous)
{
    Q_Q(QWidget);
    qCDebug(lcWidgetShowHide) << "Hiding children of" << q
                              << "spontaneously" << spontaneous;

    QList<QObject*> childList = children;
    for (int i = 0; i < childList.size(); ++i) {
        QWidget *widget = qobject_cast<QWidget*>(childList.at(i));
        if (!widget)
            continue;
        qCDebug(lcWidgetShowHide) << "Considering" << widget
              << "with attributes" << WidgetAttributes{widget};
        if (widget->isWindow() || !widget->isVisible())
            continue;

        if (spontaneous)
            widget->setAttribute(Qt::WA_Mapped, false);
        else
            widget->setAttribute(Qt::WA_WState_Visible, false);
        widget->d_func()->hideChildren(spontaneous);
        QHideEvent e;
        if (spontaneous) {
            QApplication::sendSpontaneousEvent(widget, &e);
        } else {
            QCoreApplication::sendEvent(widget, &e);
            if (widget->internalWinId()
                && widget->testAttribute(Qt::WA_DontCreateNativeAncestors)) {
                // hide_sys() on an ancestor won't have any affect on this
                // widget, so it needs an explicit hide_sys() of its own
                widget->d_func()->hide_sys();
            }
        }
        qApp->d_func()->sendSyntheticEnterLeave(widget);
#if QT_CONFIG(accessibility)
        if (!spontaneous) {
            QAccessibleEvent event(widget, QAccessible::ObjectHide);
            QAccessible::updateAccessibility(&event);
        }
#endif
    }

    // If the window of this widget is not closed, then the leave event
    // will eventually handle the widget under mouse use case.
    // Otherwise, we need to explicitly handle it here.
    if (QWidget* widgetWindow = q->window();
        widgetWindow && widgetWindow->data->is_closing) {
        q->setAttribute(Qt::WA_UnderMouse, false);
    }
}